

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void * __thiscall
CVmVarHeapHybrid_head::realloc(CVmVarHeapHybrid_head *this,void *__ptr,size_t __size)

{
  int iVar1;
  undefined4 extraout_var;
  void *__dest;
  
  if (this->cell_size_ < __size) {
    iVar1 = (*(this->mem_mgr_->super_CVmVarHeap)._vptr_CVmVarHeap[4])(this->mem_mgr_,__size);
    __dest = (void *)CONCAT44(extraout_var,iVar1);
    memcpy(__dest,(void *)((long)__ptr + 8),this->cell_size_);
    (*(this->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block[3])(this,__ptr);
  }
  else {
    __dest = (void *)((long)__ptr + 8);
  }
  return __dest;
}

Assistant:

void *CVmVarHeapHybrid_head::realloc(CVmVarHeapHybrid_hdr *mem, size_t siz,
                                     CVmObject *obj)
{
    /* 
     *   if the new block fits in our cell size, return the original
     *   memory unchanged; note that we must adjust the pointer so that we
     *   return the client-visible portion 
     */
    if (siz <= cell_size_)
        return (void *)(mem + 1);

    /*
     *   The memory won't fit in our cell size, so not only can't we
     *   re-use the existing cell, but we can't allocate the memory from
     *   our own sub-block at all.  Allocate an entirely new block from
     *   the heap manager.
     */
    void *new_mem = mem_mgr_->alloc_mem(siz, obj);

    /* 
     *   Copy the old cell's contents to the new memory.  Note that the
     *   user-visible portion of the old cell starts immediately after the
     *   header; don't copy the old header, since it's not applicable to
     *   the new object.  Note also that we got a pointer directly to the
     *   user-visible portion of the new object, so we don't need to make
     *   any adjustments to the new pointer.  
     */
    memcpy(new_mem, (void *)(mem + 1), cell_size_);

    /* free the old memory */
    free(mem);

    /* return the new memory */
    return new_mem;
}